

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

bool SetProxy(Network net,Proxy *addrProxy)

{
  bool bVar1;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock5;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (NET_INTERNAL < net) {
    __assert_fail("net >= 0 && net < NET_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                  ,0x2a9,"bool SetProxy(enum Network, const Proxy &)");
  }
  bVar1 = Proxy::IsValid(addrProxy);
  if (bVar1) {
    UniqueLock<GlobalMutex>::UniqueLock
              ((UniqueLock<GlobalMutex> *)&local_30,&g_proxyinfo_mutex,"g_proxyinfo_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
               ,0x2ac,false);
    Proxy::operator=(proxyInfo + net,addrProxy);
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool SetProxy(enum Network net, const Proxy &addrProxy) {
    assert(net >= 0 && net < NET_MAX);
    if (!addrProxy.IsValid())
        return false;
    LOCK(g_proxyinfo_mutex);
    proxyInfo[net] = addrProxy;
    return true;
}